

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_misc.cpp
# Opt level: O0

void Am_Draw_Motif_Box(int left,int top,int width,int height,bool depressed,
                      Computed_Colors_Record *rec,Am_Drawonable *draw)

{
  int iVar1;
  ulong uVar2;
  Am_Style local_50;
  Am_Style inside_fill;
  Am_Style local_38;
  Am_Style bot_fill;
  Am_Style top_fill;
  Computed_Colors_Record *rec_local;
  bool depressed_local;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  
  Am_Style::Am_Style(&bot_fill);
  Am_Style::Am_Style(&local_38);
  Am_Style::Am_Style(&local_50);
  if (depressed) {
    Am_Style::operator=(&bot_fill,&rec->data->shadow_style);
    Am_Style::operator=(&local_38,&rec->data->highlight_style);
    Am_Style::operator=(&local_50,&rec->data->background_style);
  }
  else {
    Am_Style::operator=(&bot_fill,&rec->data->highlight_style);
    Am_Style::operator=(&local_38,&rec->data->shadow_style);
    Am_Style::operator=(&local_50,&rec->data->foreground_style);
  }
  (*draw->_vptr_Am_Drawonable[0x2c])
            (draw,&Am_No_Style,&bot_fill,(ulong)(uint)left,(ulong)(uint)top,(ulong)(uint)width,
             height,0);
  uVar2 = (ulong)(uint)(left + -1 + width);
  iVar1 = top + -1 + height;
  (*draw->_vptr_Am_Drawonable[0x2a])
            (draw,&local_38,&Am_No_Style,uVar2,(ulong)(top + 1),uVar2,iVar1,left + 1,iVar1,0);
  uVar2 = (ulong)(uint)(left + -2 + width);
  iVar1 = top + -2 + height;
  (*draw->_vptr_Am_Drawonable[0x2a])
            (draw,&local_38,&Am_No_Style,uVar2,(ulong)(top + 2),uVar2,iVar1,left + 2,iVar1,0);
  (*draw->_vptr_Am_Drawonable[0x2c])
            (draw,&Am_No_Style,&local_50,(ulong)(left + 2),(ulong)(top + 2),(ulong)(width - 4),
             height + -4,0);
  Am_Style::~Am_Style(&local_50);
  Am_Style::~Am_Style(&local_38);
  Am_Style::~Am_Style(&bot_fill);
  return;
}

Assistant:

void
Am_Draw_Motif_Box(int left, int top, int width, int height, bool depressed,
                  const Computed_Colors_Record &rec, Am_Drawonable *draw)
{
  Am_Style top_fill;
  Am_Style bot_fill;
  Am_Style inside_fill;
  if (depressed) {
    top_fill = rec.data->shadow_style;
    bot_fill = rec.data->highlight_style;
    inside_fill = rec.data->background_style;
  } else {
    top_fill = rec.data->highlight_style;
    bot_fill = rec.data->shadow_style;
    inside_fill = rec.data->foreground_style;
  }
  //top edges
  draw->Draw_Rectangle(Am_No_Style, top_fill, left, top, width, height);
  //bottom edges
  draw->Draw_2_Lines(bot_fill, Am_No_Style, left + width - 1, top + 1,
                     left + width - 1, top + height - 1, left + 1,
                     top + height - 1);
  draw->Draw_2_Lines(bot_fill, Am_No_Style, left + width - 2, top + 2,
                     left + width - 2, top + height - 2, left + 2,
                     top + height - 2);

  //inside of box
  draw->Draw_Rectangle(Am_No_Style, inside_fill, left + 2, top + 2, width - 4,
                       height - 4);
}